

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O0

void __thiscall ans_smsb_encode<40U>::~ans_smsb_encode(ans_smsb_encode<40U> *this)

{
  vector<enc_entry_smsb,_std::allocator<enc_entry_smsb>_> *unaff_retaddr;
  
  std::vector<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>::~vector(unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)unaff_retaddr);
  return;
}

Assistant:

static ans_smsb_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_smsb_encode model;
        std::vector<uint64_t> freqs(smsb_constants::MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_smsb_mapping(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true, H_approx);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }